

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task28.cpp
# Opt level: O3

bool is_sort(int *arr,int len,Order type)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  
  if (type == DESC) {
    if (len < 2) {
      return true;
    }
    uVar1 = 1;
    do {
      if (arr[uVar1 - 1] < arr[uVar1]) {
        return false;
      }
      uVar1 = uVar1 + 1;
      bVar2 = (uint)len < uVar1;
      bVar3 = (uint)len == uVar1;
    } while (!bVar3);
  }
  else {
    if (len < 2) {
      return true;
    }
    uVar1 = 1;
    do {
      if (arr[uVar1] < arr[uVar1 - 1]) {
        return false;
      }
      uVar1 = uVar1 + 1;
      bVar2 = (uint)len < uVar1;
      bVar3 = (uint)len == uVar1;
    } while (!bVar3);
  }
  return bVar2 || bVar3;
}

Assistant:

bool is_sort(int* arr, int len, Order type){
    switch (type) {
        case DESC:
            for (int i = 1; i < len; i++) {
                if (arr[i - 1] < arr[i]) {
                    return false;
                }
            }
            return true;
        case ABC:
            for (int i = 1; i < len; i++) {
                if (arr[i - 1] > arr[i]) {
                    return false;
                }
            }
            return true;
    }
}